

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_done_popup(_glist *x,t_float which,t_float xpos,t_float ypos)

{
  _glist *p_Var1;
  int iVar2;
  t_propertiesfn p_Var3;
  t_symbol *ptVar4;
  t_gotfn p_Var5;
  t_atom *a;
  char *pcVar6;
  size_t sVar7;
  t_atom *av;
  int ac;
  t_object *ob;
  char *dir;
  int y2;
  int x2;
  int y1;
  int x1;
  t_gobj *y;
  char *basenamep;
  char namebuf [1000];
  t_float ypos_local;
  t_float xpos_local;
  t_float which_local;
  _glist *x_local;
  
  _y1 = (_glist *)x->gl_list;
  namebuf._996_4_ = ypos;
  do {
    if (_y1 == (_glist *)0x0) {
      if ((which != 0.0) || (NAN(which))) {
        if ((which == 2.0) && (!NAN(which))) {
          ptVar4 = canvas_getdir(x);
          open_via_helppath("intro.pd",ptVar4->s_name);
        }
      }
      else {
        canvas_properties((t_gobj *)x,(_glist *)0x0);
      }
      return;
    }
    iVar2 = canvas_hitbox(x,(t_gobj *)_y1,(int)xpos,(int)(float)namebuf._996_4_,&x2,&y2,
                          (int *)((long)&dir + 4),(int *)&dir);
    p_Var1 = _y1;
    if (iVar2 != 0) {
      if ((which != 0.0) || (NAN(which))) {
        if ((which != 1.0) || (NAN(which))) {
          if (((_y1->gl_obj).te_g.g_pd == canvas_class) &&
             (iVar2 = canvas_isabstraction(_y1), p_Var1 = _y1, iVar2 != 0)) {
            iVar2 = binbuf_getnatom((_y1->gl_obj).te_binbuf);
            a = binbuf_getvec((p_Var1->gl_obj).te_binbuf);
            if (iVar2 < 1) {
              return;
            }
            atom_string(a,(char *)&basenamep,1000);
            pcVar6 = strrchr((char *)&basenamep,0x2f);
            if (pcVar6 == (char *)0x0) {
              y = (t_gobj *)&basenamep;
            }
            else {
              y = (t_gobj *)(pcVar6 + 1);
            }
            ptVar4 = canvas_getdir(_y1);
            ob = (t_object *)ptVar4->s_name;
          }
          else {
            pcVar6 = class_gethelpname((_y1->gl_obj).te_g.g_pd);
            strncpy((char *)&basenamep,pcVar6,999);
            namebuf[0x3df] = '\0';
            ob = (t_object *)class_gethelpdir((_y1->gl_obj).te_g.g_pd);
            y = (t_gobj *)&basenamep;
          }
          sVar7 = strlen((char *)&basenamep);
          if (3 < sVar7) {
            sVar7 = strlen((char *)&basenamep);
            iVar2 = strcmp((char *)((long)&y + sVar7 + 5),".pd");
            if (iVar2 == 0) goto LAB_0016411f;
          }
          strcat((char *)&basenamep,".pd");
LAB_0016411f:
          open_via_helppath((char *)y,(char *)ob);
          return;
        }
        ptVar4 = gensym("menu-open");
        p_Var5 = zgetfn((t_pd *)p_Var1,ptVar4);
        p_Var1 = _y1;
        if (p_Var5 != (t_gotfn)0x0) {
          ptVar4 = gensym("menu-open");
          pd_vmess((t_pd *)p_Var1,ptVar4,"");
          return;
        }
      }
      else {
        p_Var3 = class_getpropertiesfn((_y1->gl_obj).te_g.g_pd);
        if (p_Var3 != (t_propertiesfn)0x0) {
          p_Var3 = class_getpropertiesfn((_y1->gl_obj).te_g.g_pd);
          (*p_Var3)((t_gobj *)_y1,x);
          return;
        }
      }
    }
    _y1 = (_glist *)(_y1->gl_obj).te_g.g_next;
  } while( true );
}

Assistant:

static void canvas_done_popup(t_canvas *x, t_float which,
    t_float xpos, t_float ypos)
{
    char namebuf[MAXPDSTRING], *basenamep;
    t_gobj *y;
    for (y = x->gl_list; y; y = y->g_next)
    {
        int x1, y1, x2, y2;
        if (canvas_hitbox(x, y, xpos, ypos, &x1, &y1, &x2, &y2))
        {
            if (which == 0)     /* properties */
            {
                if (!class_getpropertiesfn(pd_class(&y->g_pd)))
                    continue;
                (*class_getpropertiesfn(pd_class(&y->g_pd)))(y, x);
                return;
            }
            else if (which == 1)    /* open */
            {
                if (!zgetfn(&y->g_pd, gensym("menu-open")))
                    continue;
                vmess(&y->g_pd, gensym("menu-open"), "");
                return;
            }
            else    /* help */
            {
                const char *dir;
                if (pd_class(&y->g_pd) == canvas_class &&
                    canvas_isabstraction((t_canvas *)y))
                {
                    t_object *ob = (t_object *)y;
                    int ac = binbuf_getnatom(ob->te_binbuf);
                    t_atom *av = binbuf_getvec(ob->te_binbuf);
                    if (ac < 1)
                        return;
                    atom_string(av, namebuf, MAXPDSTRING);

                        /* strip dir from name : */
                    basenamep = strrchr(namebuf, '/');
#ifdef _WIN32
                    if (!basenamep)
                        basenamep = strrchr(namebuf, '\\');
#endif
                    if (!basenamep)
                        basenamep = namebuf;
                    else basenamep++;   /* strip last '/' */

                    dir = canvas_getdir((t_canvas *)y)->s_name;
                }
                else
                {
                    strncpy(namebuf, class_gethelpname(pd_class(&y->g_pd)),
                        MAXPDSTRING-1);
                    namebuf[MAXPDSTRING-1] = 0;
                    dir = class_gethelpdir(pd_class(&y->g_pd));
                    basenamep = namebuf;
                }
                if (strlen(namebuf) < 4 ||
                    strcmp(namebuf + strlen(namebuf) - 3, ".pd"))
                        strcat(namebuf, ".pd");
                open_via_helppath(basenamep, dir);
                return;
            }
        }
    }
    if (which == 0)
        canvas_properties(&x->gl_gobj, 0);
    else if (which == 2)
        open_via_helppath("intro.pd", canvas_getdir((t_canvas *)x)->s_name);
}